

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  AActor *other;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  PClass *pPVar13;
  AActor *pAVar14;
  Node *pNVar15;
  Node *pNVar16;
  AActor *pAVar17;
  AActor *pAVar18;
  byte bVar19;
  uint uVar20;
  undefined4 uVar21;
  uint uVar22;
  double dVar23;
  DVector3 oldpos;
  int local_ac;
  DVector3 local_a8;
  double local_88;
  undefined1 local_80 [8];
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FSoundID local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar12;
  undefined4 extraout_var_00;
  
  other = cres->thing;
  pAVar14 = tm->thing;
  if (other == pAVar14) {
    return (bool)1;
  }
  if ((((other->flags).Value & 7) == 0) && (((other->flags6).Value & 0x200) == 0)) {
    return (bool)1;
  }
  dVar23 = other->radius + pAVar14->radius;
  if (dVar23 <= ABS((other->__Pos).X - (cres->Position).X)) {
    return (bool)1;
  }
  if (dVar23 <= ABS((other->__Pos).Y - (cres->Position).Y)) {
    return (bool)1;
  }
  if ((((other->flags2).Value | (pAVar14->flags2).Value) >> 0x14 & 1) != 0) {
    return (bool)1;
  }
  if (((pAVar14->flags6).Value & 2) != 0) {
    (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a8);
    (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_ac,other);
    if (local_a8.X._0_4_ == local_ac) {
      return (bool)1;
    }
    pAVar14 = tm->thing;
  }
  pAVar14->BlockingMobj = other;
  dVar23 = (other->__Pos).Z + other->Height;
  if ((cres->portalflags & 0x80) == 0) {
    if ((((((byte)i_compatflags & 0x10) == 0) && (((pAVar14->flags).Value & 0x1014200) == 0)) &&
        (((other->flags).Value & 2) != 0)) &&
       (((((other->flags4).Value & 0x80) != 0 && (((pAVar14->flags3).Value & 0x2000) != 0)) &&
        ((tm->floorz <= dVar23 && (dVar23 <= (pAVar14->__Pos).Z + pAVar14->MaxStepHeight)))))) {
      tm->stepthing = other;
      tm->floorz = dVar23;
    }
    if (((tm->FromPMove == false) && (pAVar14->player == (player_t *)0x0)) ||
       (((other->flags).Value & 2) == 0)) goto LAB_00539670;
    AActor::PosRelative(&local_a8,pAVar14,other);
    dVar2 = (tm->pos).X;
    pAVar14 = tm->thing;
    if ((dVar2 != (pAVar14->__Pos).X) || (NAN(dVar2) || NAN((pAVar14->__Pos).X))) {
LAB_0053995c:
      dVar2 = (other->__Pos).X;
      dVar6 = other->radius + pAVar14->radius;
      if ((ABS(dVar2 - local_a8.X) < dVar6) &&
         (dVar3 = (other->__Pos).Y, ABS(dVar3 - local_a8.Y) < dVar6)) {
        dVar2 = dVar2 - (cres->Position).X;
        dVar3 = dVar3 - (cres->Position).Y;
        local_88 = c_sqrt(dVar3 * dVar3 + dVar2 * dVar2);
        dVar2 = (other->__Pos).X - local_a8.X;
        dVar6 = (other->__Pos).Y - local_a8.Y;
        dVar2 = c_sqrt(dVar6 * dVar6 + dVar2 * dVar2);
        pAVar14 = tm->thing;
        if (dVar2 < local_88) {
          dVar2 = (pAVar14->__Pos).Z;
          dVar6 = pAVar14->Height + dVar2;
          pdVar1 = &(other->__Pos).Z;
          if ((dVar6 < *pdVar1 || dVar6 == *pdVar1) || (bVar19 = 1, dVar23 <= dVar2)) {
            bVar19 = (byte)((other->flags3).Value >> 8) & (byte)((pAVar14->flags3).Value >> 8) & 1;
          }
          goto LAB_00539672;
        }
      }
      bVar19 = 0;
    }
    else {
      dVar2 = (tm->pos).Y;
      bVar19 = 1;
      pdVar1 = &(pAVar14->__Pos).Y;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_0053995c;
    }
  }
  else {
LAB_00539670:
    bVar19 = 0;
  }
LAB_00539672:
  uVar11 = (pAVar14->flags2).Value;
  if (((((uVar11 >> 0xc & 1) != 0) || (((other->flags4).Value & 0x80) != 0)) &&
      (((byte)i_compatflags & 0x10) == 0)) &&
     ((((uVar11 >> 8 & 1) == 0 || (((pAVar14->flags).Value & 0x10000) == 0)) ||
      ((((other->flags5).Value & 0x80000) != 0 ||
       ((((pAVar14->flags6).Value & 1) != 0 && (((other->flags2).Value & 0x8000) != 0)))))))) {
    if ((((other->flags3).Value & (pAVar14->flags3).Value) >> 8 & 1) != 0) {
      return (bool)bVar19;
    }
    dVar2 = (pAVar14->__Pos).Z;
    if (dVar23 <= dVar2) {
      return (bool)1;
    }
    if (dVar2 + pAVar14->Height <= (other->__Pos).Z) {
      return (bool)1;
    }
  }
  if ((pAVar14->player == (player_t *)0x0) || ((pAVar14->player->cheats & 0x2000) == 0)) {
    uVar11 = (other->flags6).Value;
    if ((((uVar11 >> 9 & 1) == 0) || ((((pAVar14->flags).Value & 2) == 0 || (other->health < 1))))
       || (((uVar11 >> 0xd & 1) == 0 && (bVar8 = AActor::IsSentient(other), !bVar8)))) {
LAB_005398c1:
      uVar11 = (other->flags6).Value;
    }
    else {
      if (other->player == (player_t *)0x0) {
        pPVar12 = (other->super_DThinker).super_DObject.Class;
        if (pPVar12 == (PClass *)0x0) {
          iVar9 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          pPVar12 = (PClass *)CONCAT44(extraout_var,iVar9);
          (other->super_DThinker).super_DObject.Class = pPVar12;
        }
        pAVar14 = tm->thing;
        pPVar13 = (pAVar14->super_DThinker).super_DObject.Class;
        if (pPVar13 == (PClass *)0x0) {
          iVar9 = (**(pAVar14->super_DThinker).super_DObject._vptr_DObject)(pAVar14);
          pPVar13 = (PClass *)CONCAT44(extraout_var_00,iVar9);
          (pAVar14->super_DThinker).super_DObject.Class = pPVar13;
        }
        if (pPVar12 == pPVar13) goto LAB_005398c1;
      }
      if (((other->flags6).Value & 0x40) != 0) {
        (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a8,other);
        (*(tm->thing->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_ac);
        if (local_a8.X._0_4_ == local_ac) goto LAB_005398c1;
      }
      pAVar14 = tm->thing;
      dVar2 = (pAVar14->__Pos).Z;
      if ((dVar23 < dVar2) || (dVar2 + pAVar14->Height < (other->__Pos).Z)) goto LAB_005398c1;
      pAVar18 = (other->master).field_0.p;
      if (pAVar18 == (AActor *)0x0) {
LAB_00539842:
        pAVar18 = (AActor *)0x0;
      }
      else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (other->master).field_0.p = (AActor *)0x0;
        goto LAB_00539842;
      }
      if (pAVar18 == pAVar14) goto LAB_005398c1;
      pAVar14 = (tm->thing->master).field_0.p;
      if (pAVar14 == (AActor *)0x0) {
LAB_00539869:
        pAVar14 = (AActor *)0x0;
      }
      else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (tm->thing->master).field_0.p = (AActor *)0x0;
        goto LAB_00539869;
      }
      uVar11 = (other->flags6).Value;
      if (pAVar14 != other) {
        (other->flags6).Value = uVar11 & 0xffffdfff;
        local_5c.Index = 0;
        local_38.Degrees = 0.0;
        P_DamageMobj(other,(AActor *)0x0,(AActor *)0x0,other->health,&local_5c,8,&local_38);
        return (bool)1;
      }
    }
    if (((uVar11 & 0x20) != 0) &&
       ((((pAVar14 = tm->thing, pAVar14->player != (player_t *)0x0 ||
          (((other->activationtype & 8U) != 0 && (((pAVar14->flags3).Value & 0x2000) != 0)))) ||
         (((other->activationtype & 0x10U) != 0 && (((pAVar14->flags).Value & 0x10000) != 0)))) &&
        ((other->lastbump < level.maptime &&
         (bVar8 = P_ActivateThingSpecial(other,pAVar14,false), bVar8)))))) {
      other->lastbump = level.maptime + 0x23;
    }
  }
  pAVar14 = tm->thing;
  uVar11 = (pAVar14->flags).Value;
  if ((uVar11 >> 0x18 & 1) != 0) {
    iVar9 = (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x15])
                      (pAVar14,pAVar14->BlockingMobj);
    tm->thing->BlockingMobj = (AActor *)0x0;
    return (bool)(byte)iVar9;
  }
  if ((pAVar14->player != (player_t *)0x0) && ((pAVar14->player->cheats & 0x2000) != 0)) {
    bVar8 = true;
    if (((other->flags).Value & 0x1002) == 2) {
      if ((uVar11 & 2) == 0) {
        bVar8 = ((pAVar14->flags6).Value & 0x80000) == 0;
      }
      else {
        bVar8 = false;
      }
    }
    return (bool)(bVar19 | bVar8);
  }
  uVar22 = (pAVar14->flags2).Value;
  if (((((uVar22 & 8) != 0) && (((other->flags).Value & 4) != 0)) &&
      (((other->flags2).Value & 0x8000) == 0)) && (((other->flags3).Value & 0x12000) == 0x2000)) {
    dVar23 = (other->Vel).X + (pAVar14->Vel).X;
    dVar2 = (other->Vel).Y + (pAVar14->Vel).Y;
    auVar7._8_4_ = SUB84(dVar2,0);
    auVar7._0_8_ = dVar23;
    auVar7._12_4_ = (int)((ulong)dVar2 >> 0x20);
    (other->Vel).X = dVar23;
    (other->Vel).Y = (double)auVar7._8_8_;
    if (dVar2 + dVar23 <= 3.0) {
      return (bool)0;
    }
    iVar9 = pAVar14->Mass / 100 + 1;
    local_60.Index = (pAVar14->DamageType).super_FName.Index;
    local_40.Degrees = 0.0;
    iVar10 = P_DamageMobj(other,pAVar14,pAVar14,iVar9,&local_60,0,&local_40);
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    P_TraceBleed(iVar9,other,tm->thing);
    iVar9 = other->Mass / 100 + 1;
    local_64.Index = (tm->thing->DamageType).super_FName.Index;
    local_48.Degrees = 0.0;
    iVar10 = P_DamageMobj(tm->thing,other,other,iVar9 >> 2,&local_64,0,&local_48);
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    P_TraceBleed(iVar9,tm->thing,other);
    return (bool)0;
  }
  if ((uVar11 >> 0x10 & 1) == 0) {
    uVar20 = (other->flags2).Value;
    if (((uVar11 & 2) != 0) || (((pAVar14->BounceFlags).Value & 0x1000) == 0)) {
      if (((uVar22 >> 0xd & 1) == 0 && (uVar20 >> 9 & 1) != 0) &&
         (iVar9 = tm->PushTime, other->lastpush != iVar9)) {
        dVar23 = (other->Vel).X + other->pushfactor * (pAVar14->Vel).X;
        dVar2 = (other->Vel).Y + other->pushfactor * (pAVar14->Vel).Y;
        auVar4._8_4_ = SUB84(dVar2,0);
        auVar4._0_8_ = dVar23;
        auVar4._12_4_ = (int)((ulong)dVar2 >> 0x20);
        (other->Vel).X = dVar23;
        (other->Vel).Y = (double)auVar4._8_8_;
        other->lastpush = iVar9;
      }
      uVar22 = (other->flags).Value;
      bVar8 = (uVar22 & 0x1002) != 2;
      if ((!bVar8) && ((uVar11 & 2) == 0)) {
        bVar8 = ((pAVar14->flags6).Value & 0x80000) == 0;
      }
      if (((uVar11 >> 0xb & 1) != 0 && (uVar22 & 1) != 0) &&
         (dVar23 = ((pAVar14->__Pos).Z + pAVar14->Height) - pAVar14->MaxStepHeight,
         pdVar1 = &(other->__Pos).Z, *pdVar1 <= dVar23 && dVar23 != *pdVar1)) {
        P_TouchSpecialThing(other,pAVar14);
      }
      return (bool)(bVar19 | bVar8);
    }
  }
  else {
    uVar20 = (other->flags2).Value;
  }
  if ((uVar20 >> 0x1a & 1) != 0) {
    return (bool)1;
  }
  if (((uVar22 >> 0xe & 1) != 0) && (((other->flags3).Value & 8) != 0)) {
    return (bool)1;
  }
  if ((((pAVar14->flags6).Value & 4) != 0) &&
     (pAVar18 = (pAVar14->target).field_0.p, pAVar18 != (AActor *)0x0)) {
    if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (*(pAVar18->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a8);
      (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_ac,other);
      if (local_a8.X._0_4_ == local_ac) {
        return (bool)1;
      }
    }
    else {
      (pAVar14->target).field_0.p = (AActor *)0x0;
    }
  }
  uVar11 = (other->flags).Value;
  if ((((uVar11 >> 0x14 & 1) != 0) && ((uVar11 & 4) == 0)) &&
     (((tm->thing->flags2).Value & 0x100) != 0)) {
    return (bool)1;
  }
  dVar23 = other->projectilepassheight;
  uVar21 = SUB84(dVar23,0);
  uVar22 = (uint)((ulong)dVar23 >> 0x20);
  if (dVar23 <= 0.0) {
    if ((0.0 <= dVar23) || ((i_compatflags._2_1_ & 8) == 0)) {
      uVar21 = SUB84(other->Height,0);
      uVar22 = (uint)((ulong)other->Height >> 0x20);
    }
    else {
      uVar22 = uVar22 ^ 0x80000000;
    }
  }
  pAVar14 = tm->thing;
  dVar23 = (pAVar14->__Pos).Z;
  dVar2 = (other->__Pos).Z;
  if ((double)CONCAT44(uVar22,uVar21) + dVar2 < dVar23) {
    return (bool)1;
  }
  if (dVar23 + pAVar14->Height < dVar2) {
    return (bool)1;
  }
  if ((((pAVar14->BounceFlags).Value & 8) == 0) ||
     ((pAVar14->Damage != (VMFunction *)0x0 && (((pAVar14->flags).Value & 0x10000) != 0)))) {
    iVar9 = (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x16])(pAVar14,other);
    if (iVar9 == 0) {
      return (bool)0;
    }
    if (iVar9 == 1) {
      return (bool)1;
    }
    pAVar14 = (tm->thing->target).field_0.p;
    if (pAVar14 != (AActor *)0x0) {
      if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (other == pAVar14) {
          return (bool)1;
        }
        bVar8 = CanAttackHurt(other,pAVar14);
        if (!bVar8) {
          return (bool)0;
        }
      }
      else {
        (tm->thing->target).field_0.p = (AActor *)0x0;
      }
    }
    uVar11 = (other->flags).Value;
    if ((uVar11 & 4) != 0) {
      if ((((other->flags4).Value & 0x40000) != 0) && (((tm->thing->flags4).Value & 0x40000) == 0))
      {
        return (bool)1;
      }
      if (tm->DoRipping == false) {
        pAVar14 = tm->thing;
      }
      else {
        pAVar14 = tm->thing;
        if ((((((other->flags5).Value & 0x80000) == 0) &&
             ((other->RipLevelMin < 1 || (other->RipLevelMin <= pAVar14->RipperLevel)))) &&
            ((other->RipLevelMax < 1 || (pAVar14->RipperLevel <= other->RipLevelMax)))) &&
           ((((pAVar14->flags6).Value & 1) == 0 || (((other->flags2).Value & 0x8000) == 0)))) {
          pNVar16 = (tm->LastRipped).Nodes + ((tm->LastRipped).Size - 1 & (uint)other);
          do {
            pNVar15 = pNVar16;
            if ((pNVar15 == (Node *)0x0) || (pNVar15->Next == (Node *)0x1)) goto LAB_00539fbb;
            pNVar16 = pNVar15->Next;
          } while ((pNVar15->Pair).Key != other);
          if ((pNVar15->Pair).Value == false) {
LAB_00539fbb:
            pNVar16 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::GetNode
                                (&tm->LastRipped,other);
            (pNVar16->Pair).Value = true;
            if (((((other->flags).Value & 0x80000) == 0) &&
                (uVar11 = (other->flags2).Value, -1 < (int)uVar11)) &&
               ((uVar11 & 0x18000000) == 0 && ((tm->thing->flags3).Value & 0x8000000) == 0)) {
              P_RipperBlood(tm->thing,other);
            }
            pAVar14 = tm->thing;
            local_68.ID = S_FindSound("misc/ripslop");
            S_Sound(pAVar14,4,&local_68,1.0,1.001);
            pAVar14 = tm->thing;
            iVar9 = pAVar14->PoisonDamage;
            if (0 < iVar9) {
              iVar10 = pAVar14->PoisonDuration;
              pAVar18 = (pAVar14->target).field_0.p;
              pAVar17 = pAVar14;
              if (pAVar18 == (AActor *)0x0) {
                pAVar18 = (AActor *)0x0;
              }
              else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
                (pAVar14->target).field_0.p = (AActor *)0x0;
                pAVar17 = tm->thing;
                iVar9 = pAVar17->PoisonDamage;
                iVar10 = pAVar17->PoisonDuration;
                pAVar18 = (AActor *)0x0;
              }
              local_6c.Index = (pAVar17->PoisonDamageType).super_FName.Index;
              P_PoisonMobj(other,pAVar14,pAVar18,iVar9,iVar10,pAVar17->PoisonPeriod,&local_6c);
              pAVar14 = tm->thing;
            }
            iVar9 = (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x23])(pAVar14,3,2);
            pAVar14 = tm->thing;
            pAVar18 = (pAVar14->target).field_0.p;
            pAVar17 = pAVar14;
            if (pAVar18 == (AActor *)0x0) {
              pAVar18 = (AActor *)0x0;
            }
            else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
              (pAVar14->target).field_0.p = (AActor *)0x0;
              pAVar18 = (AActor *)0x0;
              pAVar17 = tm->thing;
            }
            local_70.Index = (pAVar17->DamageType).super_FName.Index;
            local_50.Degrees = 0.0;
            iVar10 = P_DamageMobj(other,pAVar14,pAVar18,iVar9,&local_70,0,&local_50);
            if (((tm->thing->flags3).Value & 0x8000000) == 0) {
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              P_TraceBleed(iVar9,other,tm->thing);
            }
            if (((((other->flags2).Value & 0x200) != 0) &&
                (pAVar14 = tm->thing, ((pAVar14->flags2).Value & 0x2000) == 0)) &&
               (iVar9 = tm->PushTime, other->lastpush != iVar9)) {
              dVar23 = (other->Vel).X + other->pushfactor * (pAVar14->Vel).X;
              dVar2 = (other->Vel).Y + other->pushfactor * (pAVar14->Vel).Y;
              auVar5._8_4_ = SUB84(dVar2,0);
              auVar5._0_8_ = dVar23;
              auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
              (other->Vel).X = dVar23;
              (other->Vel).Y = (double)auVar5._8_8_;
              other->lastpush = iVar9;
            }
          }
          if (spechit.Count != 0) {
            spechit.Count = 0;
            return (bool)1;
          }
          return (bool)1;
        }
      }
      iVar9 = pAVar14->PoisonDamage;
      if (0 < iVar9) {
        iVar10 = pAVar14->PoisonDuration;
        pAVar18 = (pAVar14->target).field_0.p;
        pAVar17 = pAVar14;
        if (pAVar18 == (AActor *)0x0) {
          pAVar18 = (AActor *)0x0;
        }
        else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar14->target).field_0.p = (AActor *)0x0;
          pAVar17 = tm->thing;
          iVar9 = pAVar17->PoisonDamage;
          iVar10 = pAVar17->PoisonDuration;
          pAVar18 = (AActor *)0x0;
        }
        local_74.Index = (pAVar17->PoisonDamageType).super_FName.Index;
        P_PoisonMobj(other,pAVar14,pAVar18,iVar9,iVar10,pAVar17->PoisonPeriod,&local_74);
        pAVar14 = tm->thing;
      }
      iVar9 = (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x23])
                        (pAVar14,(ulong)((uint)(((pAVar14->flags4).Value >> 8 & 1) == 0) * 4 + 3),1)
      ;
      pAVar14 = tm->thing;
      if (((iVar9 < 1) && (((pAVar14->flags6).Value & 8) == 0)) &&
         (((pAVar14->flags7).Value & 0x400) == 0)) {
        P_GiveBody(other,-iVar9,0);
      }
      else {
        pAVar18 = (pAVar14->target).field_0.p;
        pAVar17 = pAVar14;
        if (pAVar18 == (AActor *)0x0) {
          pAVar18 = (AActor *)0x0;
        }
        else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar14->target).field_0.p = (AActor *)0x0;
          pAVar18 = (AActor *)0x0;
          pAVar17 = tm->thing;
        }
        local_78.Index = (pAVar17->DamageType).super_FName.Index;
        local_58.Degrees = 0.0;
        iVar10 = P_DamageMobj(other,pAVar14,pAVar18,iVar9,&local_78,0,&local_58);
        if (0 < iVar9) {
          pAVar14 = tm->thing;
          if ((((((pAVar14->flags5).Value & 0x100) != 0) && (((other->flags).Value & 0x80000) == 0))
              && (((other->flags2).Value & 0x98000000) == 0)) &&
             (((pAVar14->flags3).Value & 0x8000000) == 0)) {
            uVar11 = FRandom::GenRand32(&pr_checkthing);
            pAVar14 = tm->thing;
            if ((~uVar11 & 0xc0) != 0) {
              local_a8.X = (pAVar14->__Pos).X;
              local_a8.Y = (pAVar14->__Pos).Y;
              local_a8.Z = (pAVar14->__Pos).Z;
              AActor::AngleTo((AActor *)local_80,pAVar14,SUB81(other,0));
              P_BloodSplatter(&local_a8,other,(DAngle *)local_80);
              pAVar14 = tm->thing;
            }
          }
          if (((pAVar14->flags3).Value & 0x8000000) == 0) {
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            P_TraceBleed(iVar9,other,pAVar14);
          }
        }
      }
      if (((other->flags7).Value & 0x800) == 0) {
        return (bool)0;
      }
      if (-1 < (int)(other->flags2).Value) {
        return (bool)0;
      }
      pAVar14 = tm->thing;
      if (((pAVar14->flags).Value & 0x10000) == 0) {
        return (bool)0;
      }
      if (((pAVar14->flags2).Value & 0x40000000) != 0) {
        (pAVar14->tracer).field_0 = (pAVar14->target).field_0;
        pAVar14 = tm->thing;
      }
      (pAVar14->target).field_0.p = other;
      return (bool)1;
    }
    goto LAB_00539ef6;
  }
  pAVar18 = (pAVar14->target).field_0.p;
  if (pAVar18 == (AActor *)0x0) {
LAB_00539e88:
    pAVar18 = (AActor *)0x0;
  }
  else if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (pAVar14->target).field_0.p = (AActor *)0x0;
    goto LAB_00539e88;
  }
  if (pAVar18 == other) {
    return (bool)1;
  }
LAB_00539ef6:
  return (uVar11 & 2) == 0;
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			if (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP)
			{ // Some things prefer not to overlap each other, if possible
				return unblocking;
			}
			if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
				return true;
		}
	}

	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->Slam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if ((thing->Vel.X + thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->Damage == 0 || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}